

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O3

int Abc_NtkLevelReverse(Abc_Ntk_t *pNtk)

{
  uint *puVar1;
  ulong uVar2;
  int iVar3;
  Abc_Obj_t *pNode;
  uint uVar4;
  long lVar5;
  int *__s;
  Vec_Ptr_t *pVVar6;
  uint uVar7;
  int iVar8;
  
  pVVar6 = pNtk->vCos;
  if (0 < pVVar6->nSize) {
    lVar5 = 0;
    do {
      puVar1 = (uint *)((long)pVVar6->pArray[lVar5] + 0x14);
      *puVar1 = *puVar1 & 0xfff;
      lVar5 = lVar5 + 1;
      pVVar6 = pNtk->vCos;
    } while (lVar5 < pVVar6->nSize);
  }
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar3 = pNtk->vObjs->nSize;
    uVar2 = (long)iVar3 + 500;
    iVar8 = (int)uVar2;
    if ((pNtk->vTravIds).nCap < iVar8) {
      __s = (int *)malloc(uVar2 * 4);
      (pNtk->vTravIds).pArray = __s;
      if (__s == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vTravIds).nCap = iVar8;
    }
    else {
      __s = (int *)0x0;
    }
    if (-500 < iVar3) {
      memset(__s,0,(uVar2 & 0xffffffff) << 2);
    }
    (pNtk->vTravIds).nSize = iVar8;
  }
  iVar3 = pNtk->nTravIds;
  pNtk->nTravIds = iVar3 + 1;
  if (0x3ffffffe < iVar3) {
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                  ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  pVVar6 = pNtk->vObjs;
  if (pVVar6->nSize < 1) {
    uVar7 = 0;
  }
  else {
    lVar5 = 0;
    uVar7 = 0;
    do {
      pNode = (Abc_Obj_t *)pVVar6->pArray[lVar5];
      if ((pNode != (Abc_Obj_t *)0x0) && ((*(uint *)&pNode->field_0x14 & 0xf) == 7)) {
        Abc_NtkLevelReverse_rec(pNode);
        uVar4 = *(uint *)&pNode->field_0x14 >> 0xc;
        if (uVar7 <= uVar4) {
          uVar7 = uVar4;
        }
        pVVar6 = pNtk->vObjs;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < pVVar6->nSize);
  }
  return uVar7;
}

Assistant:

int Abc_NtkLevelReverse( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    int i, LevelsMax;
    // set the CO levels to zero
    Abc_NtkForEachCo( pNtk, pNode, i )
        pNode->Level = 0;
    // perform the traversal
    LevelsMax = 0;
    Abc_NtkIncrementTravId( pNtk );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        Abc_NtkLevelReverse_rec( pNode );
        if ( LevelsMax < (int)pNode->Level )
            LevelsMax = (int)pNode->Level;
    }
    return LevelsMax;
}